

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite22_Test::TestBody
          (LiteBasicTest_AllLite22_Test *this)

{
  TestMapLite message;
  TestMapLite local_260;
  
  proto2_unittest::TestMapLite::TestMapLite(&local_260,(Arena *)0x0);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>(&local_260);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>(&local_260);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>(&local_260);
  proto2_unittest::TestMapLite::~TestMapLite(&local_260);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite22) {
  {
    // SwapWithSelf
    proto2_unittest::TestMapLite message;

    MapTestUtil::SetMapFields(&message);
    MapTestUtil::ExpectMapFieldsSet(message);

    message.Swap(&message);
    MapTestUtil::ExpectMapFieldsSet(message);
  }
}